

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  BYTE BVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  short sVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  XXH64_hash_t XVar10;
  uint *puVar11;
  ulong uVar12;
  code *pcVar13;
  long lVar14;
  ulong uVar15;
  size_t err_code_1;
  short *psVar16;
  size_t err_code_4;
  ulong uVar17;
  ulong uVar18;
  size_t err_code_2;
  ulong uVar19;
  bool bVar20;
  undefined8 uVar21;
  BYTE *op;
  ulong local_48 [3];
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1a94,
                  "size_t ZSTD_compressSequences(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                 );
  }
  sVar7 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (sVar7 < 0xffffffffffffff89) {
    uVar21 = 0x1bc05a;
    sVar8 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
    if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
      uVar21 = 0x1bc084;
      ZSTD_XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_48[0] = 0;
    local_48[1] = 0;
    ZVar2 = (cctx->appliedParams).blockDelimiters;
    if (ZSTD_sf_explicitBlockDelimiters < ZVar2) {
      __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_blockDelimiters, mode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x19cf,"ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e)");
    }
    psVar16 = (short *)((long)dst + sVar8);
    uVar19 = dstCapacity - sVar8;
    pcVar13 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
    if ((ZVar2 & ZSTD_sf_explicitBlockDelimiters) != ZSTD_sf_noBlockDelimiters) {
      pcVar13 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    }
    if (srcSize == 0) {
      if (uVar19 < 4) {
        return 0xffffffffffffffba;
      }
      psVar16[0] = 1;
      psVar16[1] = 0;
      uVar17 = 3;
    }
    else {
      uVar17 = 0;
      uVar18 = uVar19;
      do {
        uVar9 = cctx->blockSize;
        if ((cctx->appliedParams).blockDelimiters == ZSTD_sf_noBlockDelimiters) {
          uVar15 = uVar9;
          if (srcSize < uVar9) {
            uVar15 = srcSize;
          }
          bVar20 = srcSize <= uVar9;
          if (0xffffffffffffff88 < uVar15) {
            return uVar15;
          }
        }
        else {
          uVar15 = local_48[0] & 0xffffffff;
          lVar14 = inSeqsSize - uVar15;
          if (inSeqsSize < uVar15) {
            __assert_fail("spos <= inSeqsSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x19e4,
                          "size_t blockSize_explicitDelimiter(const ZSTD_Sequence *, size_t, ZSTD_sequencePosition)"
                         );
          }
          if (inSeqsSize < uVar15 || lVar14 == 0) {
            return 0xffffffffffffff95;
          }
          puVar11 = &inSeqs[uVar15].matchLength;
          uVar15 = 0;
          while( true ) {
            uVar15 = (puVar11[-1] + *puVar11) + uVar15;
            if (((ZSTD_Sequence *)(puVar11 + -2))->offset == 0) break;
            puVar11 = puVar11 + 4;
            lVar14 = lVar14 + -1;
            if (lVar14 == 0) {
              return 0xffffffffffffff95;
            }
          }
          uVar12 = 0xffffffffffffff95;
          if (*puVar11 == 0) {
            uVar12 = uVar15;
          }
          if (0xffffffffffffff88 < uVar12) {
            return uVar12;
          }
          if (uVar9 < uVar12) {
            return 0xffffffffffffff95;
          }
          bVar20 = uVar12 == srcSize;
          if (srcSize < uVar12) {
            return 0xffffffffffffff95;
          }
        }
        (cctx->seqStore).lit = (cctx->seqStore).litStart;
        (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
        (cctx->seqStore).longLengthType = ZSTD_llt_none;
        uVar9 = (*pcVar13)(cctx,local_48,inSeqs,inSeqsSize,src,uVar15,
                           (cctx->appliedParams).searchForExternalRepcodes);
        if (0xffffffffffffff88 < uVar9) {
          return uVar9;
        }
        uVar15 = uVar15 - uVar9;
        sVar5 = (short)uVar15;
        if (uVar15 < 7) {
          uVar9 = uVar15 + 3;
          if (uVar18 < uVar9) {
            return 0xffffffffffffffba;
          }
          *psVar16 = (ushort)bVar20 + sVar5 * 8;
          *(undefined1 *)(psVar16 + 1) = 0;
          uVar21 = 0x1bc252;
          memcpy((void *)((long)psVar16 + 3),src,uVar15);
          uVar17 = uVar17 + uVar9;
        }
        else {
          if (uVar18 < 3) {
            return 0xffffffffffffffba;
          }
          sVar7 = ZSTD_entropyCompressSeqStore
                            (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                             &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,
                             (void *)((long)psVar16 + 3),uVar18 - 3,uVar15,cctx->entropyWorkspace,
                             (ulong)(uint)cctx->bmi2,(int)uVar21);
          if (0xffffffffffffff88 < sVar7) {
            return sVar7;
          }
          if (((cctx->isFirstBlock == 0) &&
              ((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart) <
               0x20)) &&
             ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) {
            uVar21 = 0x1bc374;
            iVar6 = ZSTD_isRLE((BYTE *)src,uVar15);
            if (iVar6 == 0) goto LAB_001bc2db;
LAB_001bc381:
            if (uVar18 == 3) {
              return 0xffffffffffffffba;
            }
            BVar1 = *src;
            *psVar16 = (ushort)bVar20 + sVar5 * 8 + 2;
            *(char *)(psVar16 + 1) = (char)(uVar15 >> 0xd);
            *(BYTE *)((long)psVar16 + 3) = BVar1;
            uVar9 = 4;
          }
          else {
LAB_001bc2db:
            if (sVar7 == 1) goto LAB_001bc381;
            if (sVar7 == 0) {
              uVar9 = uVar15 + 3;
              if (uVar18 < uVar9) {
                return 0xffffffffffffffba;
              }
              *psVar16 = (ushort)bVar20 + sVar5 * 8;
              *(char *)(psVar16 + 1) = (char)(uVar15 >> 0xd);
              uVar21 = 0x1bc320;
              memcpy((void *)((long)psVar16 + 3),src,uVar15);
              if (0xffffffffffffff88 < uVar9) {
                return uVar9;
              }
            }
            else {
              pZVar3 = (cctx->blockState).prevCBlock;
              pZVar4 = (cctx->blockState).nextCBlock;
              (cctx->blockState).prevCBlock = pZVar4;
              (cctx->blockState).nextCBlock = pZVar3;
              if ((pZVar4->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
                (pZVar4->entropy).fse.offcode_repeatMode = FSE_repeat_check;
              }
              *psVar16 = (ushort)bVar20 + (short)sVar7 * 8 + 4;
              *(char *)(psVar16 + 1) = (char)(sVar7 >> 0xd);
              uVar9 = sVar7 + 3;
            }
          }
          uVar17 = uVar17 + uVar9;
          if (bVar20 != false) break;
          cctx->isFirstBlock = 0;
        }
        uVar18 = uVar18 - uVar9;
        src = (void *)((long)src + uVar15);
        psVar16 = (short *)((long)psVar16 + uVar9);
        srcSize = srcSize - uVar15;
      } while (srcSize != 0);
      if (0xffffffffffffff88 < uVar17) {
        return uVar17;
      }
    }
    sVar8 = sVar8 + uVar17;
    sVar7 = sVar8;
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XVar10 = ZSTD_XXH64_digest(&cctx->xxhState);
      sVar7 = 0xffffffffffffffba;
      if (3 < uVar19 - uVar17) {
        *(int *)((long)dst + sVar8) = (int)XVar10;
        sVar7 = sVar8 + 4;
      }
    }
  }
  return sVar7;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}